

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O1

string * testing::internal::StreamableToString<int>(string *__return_storage_ptr__,int *streamable)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::operator<<((ostream *)(local_20.ptr_ + 0x10),*streamable);
  StringStreamToString(__return_storage_ptr__,local_20.ptr_);
  if (local_20.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_20.ptr_ + 8))(local_20.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}